

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

string * __thiscall
CLI::Option::_validate(string *__return_storage_ptr__,Option *this,string *result,int index)

{
  bool bVar1;
  ulong uVar2;
  ValidationError *err;
  int local_54;
  reference pVStack_50;
  int v;
  Validator *vali;
  const_iterator __end2;
  const_iterator __begin2;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *__range2;
  int index_local;
  string *result_local;
  Option *this_local;
  string *err_msg;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = ::std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) || (this->expected_min_ != 0)) {
    __end2 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::begin(&this->validators_)
    ;
    vali = (Validator *)
           std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::end(&this->validators_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                                       *)&vali), bVar1) {
      pVStack_50 = __gnu_cxx::
                   __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                   ::operator*(&__end2);
      local_54 = Validator::get_application_index(pVStack_50);
      if ((local_54 == -1) || (local_54 == index)) {
        Validator::operator()((string *)&err,pVStack_50,result);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&err);
        ::std::__cxx11::string::~string((string *)&err);
        uVar2 = ::std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          return __return_storage_ptr__;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _validate(std::string &result, int index) const {
        std::string err_msg;
        if(result.empty() && expected_min_ == 0) {
            // an empty with nothing expected is allowed
            return err_msg;
        }
        for(const auto &vali : validators_) {
            auto v = vali.get_application_index();
            if(v == -1 || v == index) {
                try {
                    err_msg = vali(result);
                } catch(const ValidationError &err) {
                    err_msg = err.what();
                }
                if(!err_msg.empty())
                    break;
            }
        }

        return err_msg;
    }